

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

ON_BrepLoop * __thiscall ON_Brep::NewLoop(ON_Brep *this,TYPE looptype)

{
  int iVar1;
  ON_BrepLoop *pOVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  ON_BoundingBox::Destroy(&this->m_bbox);
  this->m_is_solid = 0;
  iVar1 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
  uVar3 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_capacity;
  lVar4 = (long)iVar1;
  uVar5 = (uint)(lVar4 + 1U);
  if (uVar3 < uVar5) {
    ON_ClassArray<ON_BrepLoop>::SetCapacity((ON_ClassArray<ON_BrepLoop> *)&this->m_L,lVar4 + 1U);
    uVar3 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
            m_capacity;
  }
  if ((-2 < iVar1) && (iVar1 < (int)uVar3)) {
    (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count = uVar5;
  }
  pOVar2 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
  pOVar2[lVar4].m_loop_index = iVar1;
  pOVar2[lVar4].m_type = looptype;
  pOVar2[lVar4].m_brep = this;
  return pOVar2 + lVar4;
}

Assistant:

ON_BrepLoop& 
ON_Brep::NewLoop( ON_BrepLoop::TYPE looptype )
{
  // 2 Sept 2020 S. Baer (RH-59952)
  // Destroy cached bounding box on breps when messing around with loops
  m_bbox.Destroy();
  m_is_solid = 0;
  int li = m_L.Count();
  m_L.Reserve(li+1);
  m_L.SetCount(li+1);
  ON_BrepLoop& loop =  m_L.Array()[li];
  loop.m_loop_index = li;
  loop.m_type = looptype;
  loop.m_brep = this;
  return loop;
}